

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

void lzma_next_end(lzma_next_coder *next,lzma_allocator *allocator)

{
  void **ppvVar1;
  lzma_end_function p_Var2;
  lzma_allocator *__ptr;
  
  if (next->init == 0) {
    return;
  }
  __ptr = (lzma_allocator *)next->coder;
  p_Var2 = next->end;
  if (p_Var2 == (lzma_end_function)0x0) {
    if ((allocator == (lzma_allocator *)0x0) ||
       (p_Var2 = (lzma_end_function)allocator->free, p_Var2 == (lzma_end_function)0x0)) {
      free(__ptr);
      goto LAB_001a0049;
    }
    ppvVar1 = &allocator->opaque;
    allocator = __ptr;
    __ptr = (lzma_allocator *)*ppvVar1;
  }
  (*p_Var2)(__ptr,allocator);
LAB_001a0049:
  next->coder = (void *)0x0;
  next->id = 0xffffffffffffffff;
  next->update = (_func_lzma_ret_void_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr *)0x0;
  next->get_check = (_func_lzma_check_void_ptr *)0x0;
  next->memconfig = (_func_lzma_ret_void_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t *)0x0;
  next->end = (lzma_end_function)0x0;
  next->get_progress = (_func_void_void_ptr_uint64_t_ptr_uint64_t_ptr *)0x0;
  next->init = 0;
  next->code = (lzma_code_function)0x0;
  return;
}

Assistant:

extern void
lzma_next_end(lzma_next_coder *next, const lzma_allocator *allocator)
{
	if (next->init != (uintptr_t)(NULL)) {
		// To avoid tiny end functions that simply call
		// lzma_free(coder, allocator), we allow leaving next->end
		// NULL and call lzma_free() here.
		if (next->end != NULL)
			next->end(next->coder, allocator);
		else
			lzma_free(next->coder, allocator);

		// Reset the variables so the we don't accidentally think
		// that it is an already initialized coder.
		*next = LZMA_NEXT_CODER_INIT;
	}

	return;
}